

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib502.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  timeval tVar10;
  int running;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib502.c"
                  ,0x2b,iVar1,uVar2);
    goto LAB_0010239a;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib502.c"
                  ,0x2d);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar8 = _stderr;
    if (iVar1 == 0) {
      lVar4 = curl_multi_init();
      if (lVar4 == 0) {
        lVar4 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib502.c"
                      ,0x31);
        iVar1 = 0x7b;
        goto LAB_0010237a;
      }
      iVar1 = curl_multi_add_handle(lVar4,lVar3);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        local_1d0 = -99;
        local_1c8.tv_sec = 0;
        local_1c8.tv_usec = 100000;
        iVar1 = curl_multi_perform(lVar4,&local_1cc);
        if (iVar1 == 0) {
          do {
            if (local_1cc < 0) {
              pcVar9 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar8 = 0x3d;
LAB_001026c2:
              curl_mfprintf(_stderr,pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib502.c"
                            ,uVar8);
              iVar1 = 0x7a;
              goto LAB_0010237a;
            }
            tVar10 = tutil_tvnow();
            lVar5 = tutil_tvdiff(tVar10,tv_test_start);
            if (60000 < lVar5) {
              uVar8 = 0x3f;
LAB_00102735:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib502.c"
                            ,uVar8);
              iVar1 = 0x7d;
              goto LAB_0010237a;
            }
            if (local_1cc == 0) {
              iVar1 = 0;
              goto LAB_0010237a;
            }
            local_1b8.__fds_bits[0xe] = 0;
            local_1b8.__fds_bits[0xf] = 0;
            local_1b8.__fds_bits[0xc] = 0;
            local_1b8.__fds_bits[0xd] = 0;
            local_1b8.__fds_bits[10] = 0;
            local_1b8.__fds_bits[0xb] = 0;
            local_1b8.__fds_bits[8] = 0;
            local_1b8.__fds_bits[9] = 0;
            local_1b8.__fds_bits[6] = 0;
            local_1b8.__fds_bits[7] = 0;
            local_1b8.__fds_bits[4] = 0;
            local_1b8.__fds_bits[5] = 0;
            local_1b8.__fds_bits[2] = 0;
            local_1b8.__fds_bits[3] = 0;
            local_1b8.__fds_bits[0] = 0;
            local_1b8.__fds_bits[1] = 0;
            local_b8.__fds_bits[0] = 0;
            local_b8.__fds_bits[1] = 0;
            local_b8.__fds_bits[2] = 0;
            local_b8.__fds_bits[3] = 0;
            local_b8.__fds_bits[4] = 0;
            local_b8.__fds_bits[5] = 0;
            local_b8.__fds_bits[6] = 0;
            local_b8.__fds_bits[7] = 0;
            local_b8.__fds_bits[8] = 0;
            local_b8.__fds_bits[9] = 0;
            local_b8.__fds_bits[10] = 0;
            local_b8.__fds_bits[0xb] = 0;
            local_b8.__fds_bits[0xc] = 0;
            local_b8.__fds_bits[0xd] = 0;
            local_b8.__fds_bits[0xe] = 0;
            local_b8.__fds_bits[0xf] = 0;
            local_138.__fds_bits[0] = 0;
            local_138.__fds_bits[1] = 0;
            local_138.__fds_bits[2] = 0;
            local_138.__fds_bits[3] = 0;
            local_138.__fds_bits[4] = 0;
            local_138.__fds_bits[5] = 0;
            local_138.__fds_bits[6] = 0;
            local_138.__fds_bits[7] = 0;
            local_138.__fds_bits[8] = 0;
            local_138.__fds_bits[9] = 0;
            local_138.__fds_bits[10] = 0;
            local_138.__fds_bits[0xb] = 0;
            local_138.__fds_bits[0xc] = 0;
            local_138.__fds_bits[0xd] = 0;
            local_138.__fds_bits[0xe] = 0;
            local_138.__fds_bits[0xf] = 0;
            iVar1 = curl_multi_fdset(lVar4,&local_1b8,&local_b8,&local_138,&local_1d0);
            uVar8 = _stderr;
            if (iVar1 != 0) {
              uVar2 = curl_multi_strerror(iVar1);
              pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
              uVar7 = 0x48;
              goto LAB_0010233f;
            }
            if (local_1d0 < -1) {
              pcVar9 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar8 = 0x48;
              goto LAB_001026c2;
            }
            iVar1 = select_wrapper(local_1d0 + 1,&local_1b8,&local_b8,&local_138,&local_1c8);
            if (iVar1 == -1) {
              piVar6 = __errno_location();
              uVar8 = _stderr;
              iVar1 = *piVar6;
              pcVar9 = strerror(iVar1);
              curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib502.c"
                            ,0x4c,iVar1,pcVar9);
              iVar1 = 0x79;
              goto LAB_0010237a;
            }
            tVar10 = tutil_tvnow();
            lVar5 = tutil_tvdiff(tVar10,tv_test_start);
            if (60000 < lVar5) {
              uVar8 = 0x4e;
              goto LAB_00102735;
            }
            local_1d0 = -99;
            local_1c8.tv_sec = 0;
            local_1c8.tv_usec = 100000;
            iVar1 = curl_multi_perform(lVar4,&local_1cc);
          } while (iVar1 == 0);
        }
        uVar8 = _stderr;
        uVar2 = curl_multi_strerror(iVar1);
        pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uVar7 = 0x3d;
      }
      else {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uVar7 = 0x33;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uVar7 = 0x2f;
    }
LAB_0010233f:
    curl_mfprintf(uVar8,pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib502.c"
                  ,uVar7,iVar1,uVar2);
  }
LAB_0010237a:
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_0010239a:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_URL, URL);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}